

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_boolean_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  global_object_create_result *pgVar1;
  long *plVar2;
  function_object *pfVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  gc_heap_ptr<mjs::gc_function> p_1;
  value p;
  gc_heap_ptr<mjs::boolean_object> prototype;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::function_object> c;
  anon_class_32_2_842af841 get_bool_obj;
  undefined1 local_128 [16];
  gc_heap_ptr_untyped local_118;
  undefined1 local_108 [24];
  uint32_t local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  gc_heap_ptr_untyped local_b0;
  gc_heap_ptr_untyped local_a0;
  gc_heap_ptr_untyped local_90;
  undefined1 local_80 [8];
  undefined1 local_78 [32];
  gc_heap_ptr_untyped local_58;
  gc_heap_ptr_untyped local_48;
  global_object_create_result *local_38;
  
  h = (global->super_gc_heap_ptr_untyped).heap_;
  local_80 = (undefined1  [8])0x7;
  local_78._0_8_ = "Boolean";
  string::string((string *)local_e8,h,(string_view *)local_80);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x58))(local_128,plVar2);
  local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
  gc_heap::
  allocate_and_construct<mjs::boolean_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,bool>
            ((gc_heap *)local_c0,(size_t)h,(string *)0x20,(gc_heap_ptr<mjs::object> *)local_e8,
             (bool *)local_128);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
  object::class_name((object *)local_128);
  make_raw_function((mjs *)&local_90,global);
  pfVar3 = (function_object *)gc_heap_ptr_untyped::get(&local_90);
  local_80 = (undefined1  [8])0x0;
  local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_e8,(size_t)(pfVar3->super_native_object).super_object.heap_);
  pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
  *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001da6a0;
  function_object::put_function
            (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_e8,
             (gc_heap_ptr<mjs::gc_string> *)local_128,(gc_heap_ptr<mjs::gc_string> *)local_80,1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_80);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
  local_108._16_8_ = local_c0._0_8_;
  local_f0 = local_c0._8_4_;
  if ((slot *)local_c0._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)(local_108 + 0x10));
  }
  pvVar4 = gc_heap_ptr_untyped::get(&local_90);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_e8,*(size_t *)((long)pvVar4 + 8));
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e8);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001da6e0;
  *(undefined8 *)((long)pvVar5 + 0x10) = local_108._16_8_;
  *(uint32_t *)((long)pvVar5 + 0x18) = local_f0;
  if ((slot *)local_108._16_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_108._16_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
  }
  if ((*(int *)((long)pvVar4 + 0x28) == 0) && (CONCAT44(local_e8._4_4_,local_e8._0_4_) != 0)) {
    *(undefined4 *)((long)pvVar4 + 0x28) = local_e8._8_4_;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e8);
    pvVar4 = gc_heap_ptr_untyped::get(&local_90);
    value_representation::get_value
              ((value *)local_e8,(value_representation *)((long)pvVar4 + 0x38),
               *(gc_heap **)((long)pvVar4 + 8));
    if (local_e8._0_4_ != object) {
      __assert_fail("p.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                    ,0x59,
                    "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/boolean_object.cpp:47:35)]"
                   );
    }
    pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar4 + 0x20) < 1) {
      if (local_e8._0_4_ != object) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_e8 + 8));
      plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar6 + 0x98))(local_128,plVar6,"constructor");
      local_108._0_8_ = local_90.heap_;
      local_108._8_4_ = local_90.pos_;
      if (local_90.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)local_108);
      }
      local_80._0_4_ = 5;
      local_78._0_8_ = local_108._0_8_;
      local_78._8_4_ = local_108._8_4_;
      if ((gc_heap *)local_108._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_108._0_8_,(gc_heap_ptr_untyped *)local_78);
      }
      (**(code **)(*plVar2 + 8))(plVar2,local_128,local_80,2);
      value::destroy((value *)local_80);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_108);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    }
    value::destroy((value *)local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_108 + 0x10));
    plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
    plVar6 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar6 + 0x98))(local_80,plVar6,"constructor");
    local_128._0_8_ = local_90.heap_;
    local_128._8_4_ = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)local_128);
    }
    local_e8._0_4_ = object;
    local_e8._8_8_ = local_128._0_8_;
    local_e8._16_4_ = local_128._8_4_;
    if ((gc_heap *)local_128._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)(local_e8 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,local_80,local_e8,2);
    value::destroy((value *)local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_80);
    local_80 = (undefined1  [8])(global->super_gc_heap_ptr_untyped).heap_;
    local_78._0_4_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_80 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_80,(gc_heap_ptr_untyped *)local_80);
    }
    local_78._8_8_ = local_c0._0_8_;
    local_78._16_4_ = local_c0._8_4_;
    if ((slot *)local_c0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)(local_78 + 8));
    }
    local_48.heap_ = (gc_heap *)local_c0._0_8_;
    local_48.pos_ = local_c0._8_4_;
    if ((slot *)local_c0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,&local_48);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x98))(&local_58,plVar2,"toString");
    local_128._0_8_ = local_80;
    local_128._8_4_ = local_78._0_4_;
    local_38 = __return_storage_ptr__;
    if (local_80 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_80,(gc_heap_ptr_untyped *)local_128);
    }
    local_118.heap_ = (gc_heap *)local_78._8_8_;
    local_118.pos_ = local_78._16_4_;
    if ((gc_heap *)local_78._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_78._8_8_,&local_118);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_48);
    make_raw_function((mjs *)(local_c0 + 0x10),global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c0 + 0x10));
    local_108._16_8_ = (slot *)0x0;
    local_f0 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_108,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_108);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001da720;
    *(undefined8 *)((long)pvVar4 + 0x10) = local_128._0_8_;
    *(undefined4 *)((long)pvVar4 + 0x18) = local_128._8_4_;
    if ((gc_heap *)local_128._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    *(gc_heap **)((long)pvVar4 + 0x20) = local_118.heap_;
    *(uint32_t *)((long)pvVar4 + 0x28) = local_118.pos_;
    if (local_118.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_118.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_108,
               (gc_heap_ptr<mjs::gc_string> *)&local_58,
               (gc_heap_ptr<mjs::gc_string> *)(local_108 + 0x10),0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_108);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_108 + 0x10));
    local_a0.heap_ = local_b0.heap_;
    local_a0.pos_ = local_b0.pos_;
    if ((slot *)local_b0.heap_ != (slot *)0x0) {
      gc_heap::attach(local_b0.heap_,&local_a0);
    }
    local_e8._0_4_ = object;
    local_e8._8_8_ = local_a0.heap_;
    local_e8._16_4_ = local_a0.pos_;
    if ((slot *)local_a0.heap_ != (slot *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)(local_e8 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_58,local_e8,2);
    value::destroy((value *)local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_118);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
    local_48.heap_ = (gc_heap *)local_c0._0_8_;
    local_48.pos_ = local_c0._8_4_;
    if ((slot *)local_c0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,&local_48);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x98))(&local_58,plVar2,"valueOf");
    local_128._0_8_ = local_80;
    local_128._8_4_ = local_78._0_4_;
    if (local_80 != (undefined1  [8])0x0) {
      gc_heap::attach((gc_heap *)local_80,(gc_heap_ptr_untyped *)local_128);
    }
    local_118.heap_ = (gc_heap *)local_78._8_8_;
    local_118.pos_ = local_78._16_4_;
    if ((gc_heap *)local_78._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_78._8_8_,&local_118);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(&local_48);
    make_raw_function((mjs *)(local_c0 + 0x10),global);
    pfVar3 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_c0 + 0x10));
    local_108._16_8_ = (slot *)0x0;
    local_f0 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_108,(size_t)(pfVar3->super_native_object).super_object.heap_);
    pvVar4 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_108);
    *(undefined ***)((long)pvVar4 + 8) = &PTR_destroy_001da760;
    *(undefined8 *)((long)pvVar4 + 0x10) = local_128._0_8_;
    *(undefined4 *)((long)pvVar4 + 0x18) = local_128._8_4_;
    if ((gc_heap *)local_128._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_128._0_8_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x10));
    }
    *(gc_heap **)((long)pvVar4 + 0x20) = local_118.heap_;
    *(uint32_t *)((long)pvVar4 + 0x28) = local_118.pos_;
    if (local_118.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_118.heap_,(gc_heap_ptr_untyped *)((long)pvVar4 + 0x20));
    }
    function_object::put_function
              (pfVar3,(gc_heap_ptr<mjs::gc_function> *)local_108,
               (gc_heap_ptr<mjs::gc_string> *)&local_58,
               (gc_heap_ptr<mjs::gc_string> *)(local_108 + 0x10),0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_108);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_108 + 0x10));
    local_a0.heap_ = local_b0.heap_;
    local_a0.pos_ = local_b0.pos_;
    if ((slot *)local_b0.heap_ != (slot *)0x0) {
      gc_heap::attach(local_b0.heap_,&local_a0);
    }
    local_e8._0_4_ = object;
    local_e8._8_8_ = local_a0.heap_;
    local_e8._16_4_ = local_a0.pos_;
    if ((slot *)local_a0.heap_ != (slot *)0x0) {
      gc_heap::attach(local_a0.heap_,(gc_heap_ptr_untyped *)(local_e8 + 8));
    }
    (**(code **)(*plVar2 + 8))(plVar2,&local_58,local_e8,2);
    value::destroy((value *)local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_c0 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_118);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_128);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_48);
    pgVar1 = local_38;
    (local_38->obj).super_gc_heap_ptr_untyped.heap_ = local_90.heap_;
    (local_38->obj).super_gc_heap_ptr_untyped.pos_ = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)local_38);
    }
    (pgVar1->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_c0._0_8_;
    (pgVar1->prototype).super_gc_heap_ptr_untyped.pos_ = local_c0._8_4_;
    if ((slot *)local_c0._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,&(pgVar1->prototype).super_gc_heap_ptr_untyped);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_78 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c0);
    return pgVar1;
  }
  __assert_fail("!construct_ && f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x45,
                "void mjs::function_object::construct_function(const gc_heap_ptr<gc_function> &)");
}

Assistant:

global_object_create_result make_boolean_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();
    auto prototype = h.make<boolean_object>(string{h, "Boolean"}, global->object_prototype(), false);

    auto c = make_function(global, [](const value&, const std::vector<value>& args) {
        return value{!args.empty() && to_boolean(args.front())};
    },  prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [prototype](const value&, const std::vector<value>& args) {
        return value{new_boolean(prototype, !args.empty() && to_boolean(args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    auto get_bool_obj = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Boolean");
        return gc_heap_ptr<boolean_object>{this_.object_value()};
    };

    put_native_function(global, prototype, global->common_string("toString"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{string{o.heap(), o->boolean_value() ? L"true" : L"false"}};
    }, 0);

    put_native_function(global, prototype, global->common_string("valueOf"), [get_bool_obj](const value& this_, const std::vector<value>&){
        auto o = get_bool_obj(this_);
        return value{o->boolean_value()};
    }, 0);

    return { c, prototype };
}